

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

nvpair_t * nvpair_move_string(char *name,char *value)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  int _serrno;
  nvpair_t *nvp;
  char *value_local;
  char *name_local;
  
  if (value == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    name_local = (char *)0x0;
  }
  else {
    sVar3 = strlen(value);
    name_local = (char *)nvpair_allocv(name,4,(uint64_t)value,sVar3 + 1,0);
    if ((nvpair_t *)name_local == (nvpair_t *)0x0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      free(value);
      piVar2 = __errno_location();
      *piVar2 = iVar1;
    }
  }
  return (nvpair_t *)name_local;
}

Assistant:

nvpair_t *
nvpair_move_string(const char *name, char *value)
{
	nvpair_t *nvp;

	if (value == NULL) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	nvp = nvpair_allocv(name, NV_TYPE_STRING, (uint64_t)(uintptr_t)value,
	    strlen(value) + 1, 0);
	if (nvp == NULL) {
		ERRNO_SAVE();
		nv_free(value);
		ERRNO_RESTORE();
	}

	return (nvp);
}